

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

void __thiscall
google::protobuf::Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>
          (Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  Nonnull<const_char_*> failure_msg;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  anon_class_8_1_a7e8901a error;
  string local_80;
  LogMessage local_60;
  FieldDescriptor **local_50;
  FieldDescriptor *local_48;
  undefined1 local_40 [32];
  undefined8 local_20;
  char *local_18;
  ulong local_10;
  char *local_8;
  
  local_50 = &local_48;
  bVar1 = field->field_0x1;
  local_48 = field;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) != 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) - 9U < 2) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x6b9,
                 "field->cpp_type() == field->CPPTYPE_STRING || field->cpp_type() == field->CPPTYPE_MESSAGE"
                );
      const::{lambda()#1}::operator()[abi_cxx11_((string *)local_40,&local_50);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_80,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    }
  }
  else {
    VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>();
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (false,true,"field->is_repeated() == internal::IsRepeatedT<T>");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x6b3,failure_msg);
  local_8 = (local_48->all_names_).payload_;
  local_10 = (ulong)*(ushort *)(local_8 + 2);
  local_40._0_8_ = &local_10;
  local_8 = local_8 + ~local_10;
  local_40._16_8_ = &local_20;
  local_20 = 0x31;
  local_18 = "N6google8protobuf8internal20RepeatedPtrFieldBaseE";
  local_40._8_8_ =
       absl::lts_20250127::str_format_internal::FormatArgImpl::
       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_40._24_8_ =
       absl::lts_20250127::str_format_internal::FormatArgImpl::
       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = (size_t)local_40;
  format.data_ = &DAT_0000001e;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x2;
  absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
            (&local_80,(str_format_internal *)"Invalid cast of %s to type %s.",format,args);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}